

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O0

void __thiscall
xLearn::ReaderTest_ReadFromBinary_Test::TestBody(ReaderTest_ReadFromBinary_Test *this)

{
  string ffm_no_file_comma;
  string lr_no_file_comma;
  string ffm_no_file;
  string lr_no_file;
  string csv_file_comma;
  string ffm_file_comma;
  string lr_file_comma;
  string csv_file;
  string ffm_file;
  string lr_file;
  string local_158 [24];
  char *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [48];
  string local_48 [32];
  string local_28 [40];
  
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  read_from_memory((string *)lr_no_file_comma.field_2._M_allocated_capacity,
                   lr_no_file_comma._M_string_length._4_4_);
  read_from_memory((string *)lr_no_file_comma.field_2._M_allocated_capacity,
                   lr_no_file_comma._M_string_length._4_4_);
  read_from_memory((string *)lr_no_file_comma.field_2._M_allocated_capacity,
                   lr_no_file_comma._M_string_length._4_4_);
  read_from_memory((string *)lr_no_file_comma.field_2._M_allocated_capacity,
                   lr_no_file_comma._M_string_length._4_4_);
  read_from_memory((string *)lr_no_file_comma.field_2._M_allocated_capacity,
                   lr_no_file_comma._M_string_length._4_4_);
  read_from_memory((string *)lr_no_file_comma.field_2._M_allocated_capacity,
                   lr_no_file_comma._M_string_length._4_4_);
  read_from_memory((string *)lr_no_file_comma.field_2._M_allocated_capacity,
                   lr_no_file_comma._M_string_length._4_4_);
  read_from_memory((string *)lr_no_file_comma.field_2._M_allocated_capacity,
                   lr_no_file_comma._M_string_length._4_4_);
  read_from_memory((string *)lr_no_file_comma.field_2._M_allocated_capacity,
                   lr_no_file_comma._M_string_length._4_4_);
  read_from_memory((string *)lr_no_file_comma.field_2._M_allocated_capacity,
                   lr_no_file_comma._M_string_length._4_4_);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffec8);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(ReaderTest, ReadFromBinary) {
  // has label
  string lr_file = kTestfilename + "_LR.txt";
  string ffm_file = kTestfilename + "_ffm.txt";
  string csv_file = kTestfilename + "_csv.txt";
  string lr_file_comma = kTestfilename + "_LR_comma.txt";
  string ffm_file_comma = kTestfilename + "_ffm_comma.txt";
  string csv_file_comma = kTestfilename + "_csv_comma.txt";
  // has no label
  string lr_no_file = kTestfilename + "_LR_no.txt";
  string ffm_no_file = kTestfilename + "_ffm_no.txt";
  string lr_no_file_comma = kTestfilename + "_LR_no_comma.txt";
  string ffm_no_file_comma = kTestfilename + "_ffm_no_comma.txt";
  // check
  read_from_memory(lr_file, 0);
  read_from_memory(ffm_file, 1);
  read_from_memory(csv_file, 2);
  read_from_memory(lr_no_file, 3);
  read_from_memory(ffm_no_file, 4);
  read_from_memory(lr_file_comma, 0);
  read_from_memory(ffm_file_comma, 1);
  read_from_memory(csv_file_comma, 2);
  read_from_memory(lr_no_file_comma, 3);
  read_from_memory(ffm_no_file_comma, 4);  
}